

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRotUtils.h
# Opt level: O3

void chrono::fea::rotutils::RotCo<chrono::ChVector<double>,double>
               (int cid,ChVector<double> *phi,ChVector<double> *p,double *cf)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  undefined8 *puVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double phip [10];
  double local_68 [11];
  
  auVar8._8_8_ = 0;
  auVar8._0_8_ = phi->m_data[0];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = phi->m_data[2];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = phi->m_data[1] * phi->m_data[1];
  auVar8 = vfmadd231sd_fma(auVar13,auVar8,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = p->m_data[0];
  auVar13 = vfmadd213sd_fma(auVar17,auVar17,auVar8);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = p->m_data[1] * p->m_data[1];
  auVar8 = vfmadd231sd_fma(auVar14,auVar9,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = p->m_data[2];
  auVar8 = vfmadd213sd_fma(auVar10,auVar10,auVar8);
  auVar8 = vsqrtsd_avx(auVar8,auVar8);
  dVar16 = auVar13._0_8_;
  if (*(double *)(&DAT_009b74e8 + (long)cid * 8) <= auVar8._0_8_) {
    auVar8 = vsqrtsd_avx(auVar13,auVar13);
    dVar7 = auVar8._0_8_;
    dVar6 = sin(dVar7);
    *cf = dVar6 / dVar7;
    if (cid != 1) {
      dVar7 = cos(dVar7);
      auVar11._0_8_ = (1.0 - dVar7) / dVar16;
      auVar11._8_8_ = 0;
      cf[1] = auVar11._0_8_;
      if (cid != 2) {
        auVar18._8_8_ = 0;
        auVar18._0_8_ = *cf;
        auVar15._0_8_ = (1.0 - *cf) / dVar16;
        auVar15._8_8_ = 0;
        cf[2] = auVar15._0_8_;
        if (cid != 3) {
          auVar8 = vfmadd231sd_fma(auVar18,auVar11,ZEXT816(0xc000000000000000));
          auVar19._0_8_ = auVar8._0_8_ / dVar16;
          auVar19._8_8_ = auVar8._8_8_;
          cf[3] = auVar19._0_8_;
          if (cid != 4) {
            auVar8 = vfmadd213sd_fma(ZEXT816(0xc008000000000000),auVar15,auVar11);
            cf[4] = auVar8._0_8_ / dVar16;
            if (cid != 5) {
              auVar12._8_8_ = 0;
              auVar12._0_8_ = auVar15._0_8_ - auVar11._0_8_;
              auVar8 = vfmadd231sd_fma(auVar12,auVar19,ZEXT816(0xc010000000000000));
              cf[5] = auVar8._0_8_ / dVar16;
            }
          }
        }
      }
    }
  }
  else {
    dVar7 = 1.0;
    local_68[0] = 1.0;
    lVar3 = 1;
    do {
      dVar7 = dVar16 * dVar7;
      local_68[lVar3] = dVar7;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 10);
    if (0 < cid) {
      puVar4 = &SerCoeff;
      uVar5 = 0;
      do {
        dVar16 = 0.0;
        lVar3 = 0;
        do {
          pdVar2 = local_68 + lVar3;
          pdVar1 = (double *)(puVar4 + lVar3);
          lVar3 = lVar3 + 1;
          dVar16 = dVar16 + *pdVar2 / *pdVar1;
        } while (lVar3 != 9);
        cf[uVar5] = dVar16;
        uVar5 = uVar5 + 1;
        puVar4 = puVar4 + 9;
      } while (uVar5 != (uint)cid);
    }
  }
  return;
}

Assistant:

void RotCo(const int cid, const T1& phi, const ChVector<>& p, T2* const cf) {
    T2 phip[10];
    T2 phi2(phi ^ phi);
    double mp(p.Length());  // (sqrt(p.Dot()));
    int k, j;

    if (mp < SerThrsh[cid - 1]) {
        phip[0] = 1.;
        for (j = 1; j <= 9; j++) {
            phip[j] = phip[j - 1] * phi2;
        }
        for (k = 0; k < cid; k++) {
            cf[k] = 0.;
            for (j = 0; j < SerTrunc[k]; j++) {
                cf[k] += phip[j] / SerCoeff[k][j];
            }
        }

        return;
    }

    const T2 ID(1.);
    T2 pd(sqrt(phi2));
    cf[0] = sin(pd) / pd;  // a = sin(phi)/phi
    if (cid == 1)
        return;
    cf[1] = (ID - cos(pd)) / phi2;  // b = (1.-cos(phi))/phi2
    if (cid == 2)
        return;
    cf[2] = (ID - cf[0]) / phi2;  // c = (1.-a)/phi2
    if (cid == 3)
        return;
    cf[3] = (cf[0] - (cf[1] * 2.)) / phi2;  // d = (a-2*b)/phi2
    if (cid == 4)
        return;
    cf[4] = (cf[1] - (cf[2] * 3.)) / phi2;  // e = (b-3*c)/phi2
    if (cid == 5)
        return;
    cf[5] = (cf[2] - cf[1] - (cf[3] * 4.)) / phi2;  // f = (c-b-4*d)/phi2
    // if (cid == 6) return; inutile
    return;
}